

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.h
# Opt level: O2

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::ClassId(TPZCompElHDiv<pzshape::TPZShapeTriang> *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TPZCompElHDiv",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZIntelGen<pzshape::TPZShapeTriang>::ClassId
                    (&this->super_TPZIntelGen<pzshape::TPZShapeTriang>);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::ClassId() const{
    return Hash("TPZCompElHDiv") ^ TPZIntelGen<TSHAPE>::ClassId() << 1;
}